

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cc
# Opt level: O1

void __thiscall
flow::Handler::setCode(Handler *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *code)

{
  iterator __position;
  Instruction *program;
  unsigned_long in_RAX;
  size_t sVar1;
  unsigned_long local_18;
  
  local_18 = in_RAX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&this->code_);
  __position._M_current =
       (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((char)__position._M_current[-1] != '\a') {
    local_18 = 7;
    if (__position._M_current ==
        (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->code_,__position,&local_18);
    }
    else {
      *__position._M_current = 7;
      (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  program = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar1 = computeStackSize(program,(long)(this->code_).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)program
                                   >> 3);
  this->stackSize_ = sVar1;
  return;
}

Assistant:

void Handler::setCode(std::vector<Instruction> code) {
  code_ = std::move(code);

  if (opcode(code_.back()) != Opcode::EXIT)
    code_.push_back(makeInstruction(Opcode::EXIT, false));

  stackSize_ = computeStackSize(code_.data(), code_.size());

#if defined(ENABLE_FLOW_DIRECT_THREADED_VM)
  directThreadedCode_.clear();
#endif
}